

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzautopointer.h
# Opt level: O1

TPZAutoPointer<TPZDohrAssembleItem<std::complex<double>_>_> * __thiscall
TPZAutoPointer<TPZDohrAssembleItem<std::complex<double>_>_>::operator=
          (TPZAutoPointer<TPZDohrAssembleItem<std::complex<double>_>_> *this,
          TPZDohrAssembleItem<std::complex<double>_> *rval)

{
  bool bVar1;
  TPZReference *pTVar2;
  
  if (this->fRef != (TPZReference *)0x0) {
    bVar1 = TPZReference::Decrease(this->fRef);
    if (bVar1) {
      if (((this->fRef != (TPZReference *)0x0) &&
          ((this->fRef->fCounter).super___atomic_base<int>._M_i == 0)) &&
         (pTVar2 = this->fRef, pTVar2 != (TPZReference *)0x0)) {
        TPZReference::~TPZReference(pTVar2);
        operator_delete(pTVar2,0x10);
      }
      this->fRef = (TPZReference *)0x0;
    }
  }
  pTVar2 = (TPZReference *)operator_new(0x10);
  (pTVar2->fCounter).super___atomic_base<int>._M_i = 0;
  pTVar2->fPointer = rval;
  LOCK();
  (pTVar2->fCounter).super___atomic_base<int>._M_i = 1;
  UNLOCK();
  this->fRef = pTVar2;
  return this;
}

Assistant:

TPZAutoPointer &operator=(T *rval)
    {
        if (fRef && fRef->Decrease()){
            Release();
        }
        fRef = new TPZReference(rval);
        return *this;
    }